

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_transfer_particle_contents(FILE *fo,mcpl_file_t ffi,uint64_t nparticles)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t __n;
  ulong uVar5;
  
  if (nparticles == 0) {
    return;
  }
  uVar1 = *(uint *)((long)ffi.internal + 0x78);
  pcVar3 = mcpl_internal_malloc((ulong)(uVar1 * 1000));
  while( true ) {
    if (nparticles == 0) {
      free(pcVar3);
      return;
    }
    uVar5 = 1000;
    if (nparticles < 1000) {
      uVar5 = nparticles;
    }
    if (*(long *)((long)ffi.internal + 8) == 0) {
      sVar4 = fread(pcVar3,1,uVar5 * uVar1,*ffi.internal);
    }
    else {
      iVar2 = gzread(*(long *)((long)ffi.internal + 8),pcVar3,uVar1 * (int)uVar5);
      sVar4 = (size_t)iVar2;
    }
    __n = uVar5 * uVar1;
    if (sVar4 != __n) break;
    nparticles = nparticles - uVar5;
    sVar4 = fwrite(pcVar3,1,__n,(FILE *)fo);
    if (sVar4 != __n) {
      pcVar3 = "Unexpected write-error while merging";
LAB_0010578f:
      (*mcpl_error_handler)(pcVar3);
      printf("MCPL ERROR: %s\n",
             "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!"
            );
      exit(1);
    }
  }
  pcVar3 = "Unexpected read-error while merging";
  goto LAB_0010578f;
}

Assistant:

void mcpl_transfer_particle_contents(FILE * fo, mcpl_file_t ffi, uint64_t nparticles)
{
  mcpl_fileinternal_t * fi = (mcpl_fileinternal_t *)ffi.internal;
  assert(fi);

  if (!nparticles)
    return;//no particles to transfer

  unsigned particle_size = fi->particle_size;

  //buffer for transferring up to 1000 particles at a time:
  const unsigned npbufsize = 1000;
  char * buf = mcpl_internal_malloc(npbufsize*particle_size);
  uint64_t np_remaining = nparticles;

  while(np_remaining) {
    //NB: On linux > 2.6.33 we could use sendfile for more efficient in-kernel
    //transfer of data between two files!
    uint64_t toread = np_remaining >= npbufsize ? npbufsize : np_remaining;
    np_remaining -= toread;

    //read:
    uint64_t nb;
    if (fi->filegz) {
      assert( ((unsigned)toread)*particle_size < UINT32_MAX );
      nb = gzread(fi->filegz, buf, ((unsigned)toread)*particle_size);
    } else {
      nb = fread(buf,1,toread*particle_size,fi->file);
    }
    if (nb!=toread*particle_size)
      mcpl_error("Unexpected read-error while merging");

    //write:
    nb = fwrite(buf,1,toread*particle_size,fo);
    if (nb!=toread*particle_size)
      mcpl_error("Unexpected write-error while merging");
  }

  free(buf);
}